

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

VectorStringBuffer * duckdb::StringVector::GetStringBuffer(Vector *vector)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Alloc_hider _Var1;
  size_type sVar2;
  VectorStringBuffer *pVVar3;
  InternalException *this_00;
  string local_58;
  LogicalType local_38;
  
  if ((vector->type).physical_type_ == VARCHAR) {
    pVVar3 = (VectorStringBuffer *)
             (vector->auxiliary).internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pVVar3 == (VectorStringBuffer *)0x0) {
      make_buffer<duckdb::VectorStringBuffer>();
      sVar2 = local_58._M_string_length;
      _Var1._M_p = local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      this = (vector->auxiliary).internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (vector->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var1._M_p;
      (vector->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
        }
      }
      pVVar3 = (VectorStringBuffer *)
               (vector->auxiliary).internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    return pVVar3;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "StringVector::GetStringBuffer - vector is not of internal type VARCHAR but of type %s"
             ,"");
  LogicalType::LogicalType(&local_38,&vector->type);
  InternalException::InternalException<duckdb::LogicalType>(this_00,&local_58,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

VectorStringBuffer &StringVector::GetStringBuffer(Vector &vector) {
	if (vector.GetType().InternalType() != PhysicalType::VARCHAR) {
		throw InternalException("StringVector::GetStringBuffer - vector is not of internal type VARCHAR but of type %s",
		                        vector.GetType());
	}
	if (!vector.auxiliary) {
		vector.auxiliary = make_buffer<VectorStringBuffer>();
	}
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::STRING_BUFFER);
	return vector.auxiliary.get()->Cast<VectorStringBuffer>();
}